

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanim.cpp
# Opt level: O2

int32 __thiscall rw::HAnimHierarchy::getIndex(HAnimHierarchy *this,int32 id)

{
  ulong uVar1;
  ulong uVar2;
  HAnimNodeInfo *pHVar3;
  
  pHVar3 = this->nodeInfo;
  uVar1 = 0;
  uVar2 = (ulong)(uint)this->numNodes;
  if (this->numNodes < 1) {
    uVar2 = uVar1;
  }
  while( true ) {
    if (uVar2 == uVar1) {
      return -1;
    }
    if (pHVar3->id == id) break;
    uVar1 = uVar1 + 1;
    pHVar3 = pHVar3 + 1;
  }
  return (int32)uVar1;
}

Assistant:

int32
HAnimHierarchy::getIndex(int32 id)
{
	for(int32 i = 0; i < this->numNodes; i++)
		if(this->nodeInfo[i].id == id)
			return i;
	return -1;
}